

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O0

OPJ_BOOL opj_jp2_setup_header_writing(opj_jp2_t *jp2,opj_event_mgr_t *p_manager)

{
  OPJ_BOOL OVar1;
  opj_event_mgr_t *p_manager_local;
  opj_jp2_t *jp2_local;
  
  if (jp2 == (opj_jp2_t *)0x0) {
    __assert_fail("jp2 != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/jp2.c"
                  ,0xb5f,"OPJ_BOOL opj_jp2_setup_header_writing(opj_jp2_t *, opj_event_mgr_t *)");
  }
  if (p_manager != (opj_event_mgr_t *)0x0) {
    OVar1 = opj_procedure_list_add_procedure(jp2->m_procedure_list,opj_jp2_write_jp,p_manager);
    if (OVar1 == 0) {
      jp2_local._4_4_ = 0;
    }
    else {
      OVar1 = opj_procedure_list_add_procedure(jp2->m_procedure_list,opj_jp2_write_ftyp,p_manager);
      if (OVar1 == 0) {
        jp2_local._4_4_ = 0;
      }
      else {
        OVar1 = opj_procedure_list_add_procedure(jp2->m_procedure_list,opj_jp2_write_jp2h,p_manager)
        ;
        if (OVar1 == 0) {
          jp2_local._4_4_ = 0;
        }
        else if ((jp2->jpip_on == 0) ||
                (OVar1 = opj_procedure_list_add_procedure
                                   (jp2->m_procedure_list,opj_jpip_skip_iptr,p_manager), OVar1 != 0)
                ) {
          OVar1 = opj_procedure_list_add_procedure
                            (jp2->m_procedure_list,opj_jp2_skip_jp2c,p_manager);
          if (OVar1 == 0) {
            jp2_local._4_4_ = 0;
          }
          else {
            jp2_local._4_4_ = 1;
          }
        }
        else {
          jp2_local._4_4_ = 0;
        }
      }
    }
    return jp2_local._4_4_;
  }
  __assert_fail("p_manager != 00",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/jp2.c"
                ,0xb60,"OPJ_BOOL opj_jp2_setup_header_writing(opj_jp2_t *, opj_event_mgr_t *)");
}

Assistant:

static OPJ_BOOL opj_jp2_setup_header_writing(opj_jp2_t *jp2,
        opj_event_mgr_t * p_manager)
{
    /* preconditions */
    assert(jp2 != 00);
    assert(p_manager != 00);

    if (! opj_procedure_list_add_procedure(jp2->m_procedure_list,
                                           (opj_procedure)opj_jp2_write_jp, p_manager)) {
        return OPJ_FALSE;
    }
    if (! opj_procedure_list_add_procedure(jp2->m_procedure_list,
                                           (opj_procedure)opj_jp2_write_ftyp, p_manager)) {
        return OPJ_FALSE;
    }
    if (! opj_procedure_list_add_procedure(jp2->m_procedure_list,
                                           (opj_procedure)opj_jp2_write_jp2h, p_manager)) {
        return OPJ_FALSE;
    }
    if (jp2->jpip_on) {
        if (! opj_procedure_list_add_procedure(jp2->m_procedure_list,
                                               (opj_procedure)opj_jpip_skip_iptr, p_manager)) {
            return OPJ_FALSE;
        }
    }
    if (! opj_procedure_list_add_procedure(jp2->m_procedure_list,
                                           (opj_procedure)opj_jp2_skip_jp2c, p_manager)) {
        return OPJ_FALSE;
    }

    /* DEVELOPER CORNER, insert your custom procedures */

    return OPJ_TRUE;
}